

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O1

char * sx_strstr(char *str,char *find)

{
  char ch;
  code *pcVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  char *__s1;
  
  if (str == (char *)0x0) {
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/string.c",
                      0x15b,"str");
    pcVar1 = (code *)swi(3);
    pcVar5 = (char *)(*pcVar1)();
    return pcVar5;
  }
  if (find == (char *)0x0) {
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/string.c",
                      0x15c,"find");
    pcVar1 = (code *)swi(3);
    pcVar5 = (char *)(*pcVar1)();
    return pcVar5;
  }
  ch = *find;
  pcVar5 = sx_strchar(str,ch);
  iVar2 = sx_strlen(find);
  iVar3 = sx_strlen(str);
  if (pcVar5 != (char *)0x0) {
    do {
      __s1 = pcVar5;
      iVar3 = ((int)str - (int)__s1) + iVar3;
      if (iVar3 < iVar2) {
        return (char *)0x0;
      }
      iVar4 = bcmp(__s1,find,(long)iVar2);
      if (iVar4 == 0) {
        return __s1;
      }
      pcVar5 = sx_strchar(__s1 + 1,ch);
      str = __s1;
    } while (pcVar5 != (char *)0x0);
  }
  return (char *)0x0;
}

Assistant:

const char* sx_strstr(const char* SX_RESTRICT str, const char* SX_RESTRICT find)
{
    sx_assert(str);
    sx_assert(find);

    char ch = find[0];
    const char* _start = sx_strchar(str, ch);
    int find_len = sx_strlen(find);
    int len = sx_strlen(str);

    while (_start) {
        // We have the first character, check the rest
        len -= (int)(intptr_t)(_start - str);
        if (len < find_len)
            return NULL;
        str = _start;

        if (sx_memcmp(_start, find, find_len) == 0)
            return str;

        _start = sx_strchar(_start + 1, ch);
    }

    return NULL;
}